

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

char * get_cpu_name(void)

{
  char cVar1;
  FILE *__stream;
  char *pcVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char *pcVar5;
  
  __stream = fopen("/proc/cpuinfo","r");
  pcVar4 = "Unknown";
  do {
    pcVar2 = fgets(get_cpu_name::buffer,0x200,__stream);
    if (pcVar2 == (char *)0x0) goto LAB_00102053;
    pcVar2 = strstr(get_cpu_name::buffer,"model name");
  } while ((pcVar2 == (char *)0x0) ||
          (pcVar2 = strchr(get_cpu_name::buffer,0x3a), pcVar2 == (char *)0x0));
  ppuVar3 = __ctype_b_loc();
  pcVar2 = pcVar2 + 1;
  do {
    pcVar4 = pcVar2;
    pcVar2 = pcVar4 + 1;
    pcVar5 = pcVar2;
  } while ((*(byte *)((long)*ppuVar3 + (long)*pcVar4 * 2 + 1) & 0x20) != 0);
  while( true ) {
    cVar1 = *pcVar5;
    if ((long)cVar1 == 0) break;
    if (((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) == 0) ||
       ((*(byte *)((long)*ppuVar3 + (long)pcVar2[-1] * 2 + 1) & 0x20) == 0)) {
      *pcVar2 = cVar1;
      pcVar2 = pcVar2 + 1;
    }
    pcVar5 = pcVar5 + 1;
  }
  *pcVar2 = '\0';
LAB_00102053:
  fclose(__stream);
  return pcVar4;
}

Assistant:

const char *
get_cpu_name (void)
{
	const char *name = "Unknown", *search = NULL ;
	static char buffer [512] ;
	FILE * file = NULL ;
	int is_pipe = 0 ;

#if defined (__linux__)
	file = fopen ("/proc/cpuinfo", "r") ;
	search = "model name" ;
#elif defined (__APPLE__)
	file = popen ("/usr/sbin/system_profiler -detailLevel full SPHardwareDataType", "r") ;
	search = "Processor Name" ;
	is_pipe = 1 ;
#elif defined (__FreeBSD__) || defined (__OpenBSD__)
	file = popen ("sysctl -a", "r") ;
	search = "hw.model" ;
	is_pipe = 1 ;
#else
	(void) search ;
	(void) buffer ;
	(void) file ;
	(void) is_pipe ;

	return name;
#endif

#if defined (__linux__) || defined (__APPLE__) || defined (__FreeBSD__) || defined (__OpenBSD__)
	if (search == NULL)
	{	printf ("Error : search is NULL in function %s.\n", __func__) ;
		return name ;
		} ;

	while (fgets (buffer, sizeof (buffer), file) != NULL)
		if (strstr (buffer, search))
		{	char *src, *dest ;

			if ((src = strchr (buffer, ':')) != NULL)
			{	src ++ ;
				while (isspace (src [0]))
					src ++ ;
				name = src ;

				/* Remove consecutive spaces. */
				src ++ ;
				for (dest = src ; src [0] ; src ++)
				{	if (isspace (src [0]) && isspace (dest [-1]))
						continue ;
					dest [0] = src [0] ;
					dest ++ ;
					} ;
				dest [0] = 0 ;
				break ;
				} ;
			} ;

	if (is_pipe)
		pclose (file) ;
	else
		fclose (file) ;

	return name ;
#endif
}